

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall
wasm::BinaryInstWriter::visitStructCmpxchg(BinaryInstWriter *this,StructCmpxchg *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  WasmBinaryWriter *this_01;
  bool bVar1;
  HeapType type;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_22 [2];
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  if (bVar1) {
    local_22[1] = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,local_22 + 1);
  }
  else {
    local_22[0] = 0xfe;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,local_22);
    local_28.value = 0x66;
    LEB<unsigned_int,_unsigned_char>::write(&local_28,(int)this_00,__buf,in_RCX);
    WasmBinaryWriter::writeMemoryOrder(this->parent,curr->order,true);
    this_01 = this->parent;
    type = wasm::Type::getHeapType(&curr->ref->type);
    WasmBinaryWriter::writeIndexedHeapType(this_01,type);
    local_2c.value = curr->index;
    LEB<unsigned_int,_unsigned_char>::write(&local_2c,(int)this->o,__buf_00,in_RCX);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStructCmpxchg(StructCmpxchg* curr) {
  if (curr->ref->type.isNull()) {
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::AtomicPrefix)
    << U32LEB(BinaryConsts::StructAtomicRMWCmpxchg);
  parent.writeMemoryOrder(curr->order, /*isRMW=*/true);
  parent.writeIndexedHeapType(curr->ref->type.getHeapType());
  o << U32LEB(curr->index);
}